

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O3

void __thiscall toml::Value::Value(Value *this,string *v)

{
  pointer pcVar1;
  string *psVar2;
  
  this->type_ = STRING_TYPE;
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  pcVar1 = (v->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)psVar2,pcVar1,pcVar1 + v->_M_string_length);
  (this->field_1).string_ = psVar2;
  return;
}

Assistant:

Value(const std::string& v) : type_(STRING_TYPE), string_(new std::string(v)) {}